

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLAttDef::XMLAttDef
          (XMLAttDef *this,XMLCh *attrValue,AttTypes type,DefAttTypes defType,XMLCh *enumValues,
          MemoryManager *manager)

{
  XMLCh *pXVar1;
  OutOfMemoryException *anon_var_0;
  undefined1 local_58 [8];
  CleanupType_conflict8 cleanup;
  MemoryManager *manager_local;
  XMLCh *enumValues_local;
  DefAttTypes defType_local;
  AttTypes type_local;
  XMLCh *attrValue_local;
  XMLAttDef *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLAttDef_0052ece8;
  this->fDefaultType = defType;
  this->fType = type;
  this->fCreateReason = NoReason;
  this->fExternalAttribute = false;
  this->fId = 0xfffffffe;
  this->fValue = (XMLCh *)0x0;
  this->fEnumeration = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLAttDef> *)local_58,this,(MFPT)cleanUp);
  pXVar1 = XMLString::replicate(attrValue,this->fMemoryManager);
  this->fValue = pXVar1;
  pXVar1 = XMLString::replicate(enumValues,this->fMemoryManager);
  this->fEnumeration = pXVar1;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLAttDef> *)local_58);
  JanitorMemFunCall<xercesc_4_0::XMLAttDef>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLAttDef> *)local_58);
  return;
}

Assistant:

XMLAttDef::XMLAttDef( const XMLCh* const           attrValue
                    , const XMLAttDef::AttTypes    type
                    , const XMLAttDef::DefAttTypes defType
                    , const XMLCh* const           enumValues
                    , MemoryManager* const         manager) :

    fDefaultType(defType)
    , fType(type)
    , fCreateReason(XMLAttDef::NoReason)
    , fExternalAttribute(false)
    , fId(XMLAttDef::fgInvalidAttrId)
    , fValue(0)
    , fEnumeration(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLAttDef::cleanUp);

    try
    {
        fValue = XMLString::replicate(attrValue, fMemoryManager);
        fEnumeration = XMLString::replicate(enumValues, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}